

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cc
# Opt level: O0

void __thiscall flow::lang::ParamList::dump(ParamList *this,char *title)

{
  size_t sVar1;
  undefined8 uVar2;
  reference this_00;
  ASTNode *node;
  int local_1c;
  int e;
  int i;
  char *title_local;
  ParamList *this_local;
  
  if ((title != (char *)0x0) && (*title != '\0')) {
    printf("%s\n",title);
  }
  local_1c = 0;
  sVar1 = size(this);
  for (; local_1c != (int)sVar1; local_1c = local_1c + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&this->names_,(long)local_1c);
    uVar2 = std::__cxx11::string::c_str();
    printf("%16s: ",uVar2);
    this_00 = std::
              vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
              ::operator[](&this->values_,(long)local_1c);
    node = &std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::get(this_00)
            ->super_ASTNode;
    ASTPrinter::print(node);
  }
  return;
}

Assistant:

void ParamList::dump(const char* title) {
  if (title && *title) {
    printf("%s\n", title);
  }
  for (int i = 0, e = size(); i != e; ++i) {
    printf("%16s: ", names_[i].c_str());
    ASTPrinter::print(values_[i].get());
  }
}